

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O3

int write_directory_descriptors(archive_write *a,vdd *vdd)

{
  iso9660_conflict *iso9660_00;
  size_t sVar1;
  isoent **ppiVar2;
  content_conflict *pcVar3;
  void *pvVar4;
  int iVar5;
  isoent *isoent;
  isoent *piVar6;
  int iVar7;
  long lVar8;
  isoent *piVar9;
  isofile *piVar10;
  extr_rec *peVar11;
  iso9660_conflict *iso9660;
  uchar *p;
  uchar *puVar12;
  bool bVar13;
  
  iVar7 = 0;
  isoent = vdd->rootent;
  do {
    iso9660_00 = (iso9660_conflict *)a->format_data;
    sVar1 = iso9660_00->wbuff_remaining;
    p = (uchar *)((long)iso9660_00 + (0x102dc - sVar1));
    iVar5 = set_directory_record(p,0x800,isoent,iso9660_00,DIR_REC_SELF,vdd->vdd_type);
    puVar12 = (uchar *)((long)iso9660_00 + ((long)iVar5 - sVar1) + 0x102dc);
    iVar5 = set_directory_record
                      (puVar12,0x800 - (long)iVar5,isoent,iso9660_00,DIR_REC_PARENT,vdd->vdd_type);
    puVar12 = puVar12 + iVar5;
    if (((isoent->children).cnt < 1) ||
       (((vdd->vdd_type != VDD_JOLIET && ((*(ushort *)&(iso9660_00->opt).field_0x2 & 0x180) == 0))
        && (vdd->max_depth <= iVar7 + 1)))) {
      memset(puVar12,0,(size_t)(p + (0x800 - (long)puVar12)));
      iVar5 = wb_consume(a,0x800);
    }
    else {
      ppiVar2 = isoent->children_sorted;
      lVar8 = 0;
      do {
        piVar6 = ppiVar2[lVar8];
        piVar10 = piVar6->file->hardlink_target;
        if (piVar10 == (isofile *)0x0) {
          piVar10 = piVar6->file;
        }
        piVar10->cur_content = &piVar10->content;
        do {
          iVar5 = set_directory_record
                            (puVar12,(size_t)(p + (0x800 - (long)puVar12)),piVar6,iso9660_00,
                             DIR_REC_NORMAL,vdd->vdd_type);
          if (iVar5 == 0) {
            memset(puVar12,0,(size_t)(p + (0x800 - (long)puVar12)));
            iVar5 = wb_consume(a,0x800);
            if (iVar5 < 0) {
              return iVar5;
            }
            puVar12 = (uchar *)((long)a->format_data +
                               (0x102dc - *(long *)((long)a->format_data + 0x102e0)));
            iVar5 = set_directory_record
                              (puVar12,0x800,piVar6,iso9660_00,DIR_REC_NORMAL,vdd->vdd_type);
            p = puVar12;
          }
          puVar12 = puVar12 + iVar5;
          pcVar3 = piVar10->cur_content->next;
          piVar10->cur_content = pcVar3;
        } while (pcVar3 != (content_conflict *)0x0);
        lVar8 = lVar8 + 1;
      } while (lVar8 < (isoent->children).cnt);
      memset(puVar12,0,(size_t)(p + (0x800 - (long)puVar12)));
      iVar5 = wb_consume(a,0x800);
    }
    if (iVar5 < 0) {
      return iVar5;
    }
    if (vdd->vdd_type != VDD_JOLIET) {
      for (peVar11 = (isoent->extr_rec_list).first; peVar11 != (extr_rec *)0x0;
          peVar11 = peVar11->next) {
        pvVar4 = a->format_data;
        lVar8 = *(long *)((long)pvVar4 + 0x102e0);
        memcpy((void *)((long)pvVar4 + (0x102dc - lVar8)),peVar11->buf,(long)peVar11->offset);
        memset((void *)((long)pvVar4 + (peVar11->offset - lVar8) + 0x102dc),0,
               0x800 - (long)peVar11->offset);
        iVar5 = wb_consume(a,0x800);
        if (iVar5 < 0) {
          return iVar5;
        }
      }
    }
    piVar6 = (isoent->subdirs).first;
    if (((piVar6 == (isoent *)0x0) || (iVar5 = iVar7 + 1, vdd->max_depth <= iVar7 + 1)) &&
       (piVar9 = isoent->parent, piVar6 = isoent, iVar5 = iVar7, isoent != piVar9)) {
      do {
        piVar6 = isoent->drnext;
        iVar5 = iVar7;
        if (isoent->drnext != (isoent *)0x0) break;
        iVar7 = iVar7 + -1;
        bVar13 = piVar9 != piVar9->parent;
        piVar6 = piVar9;
        isoent = piVar9;
        piVar9 = piVar9->parent;
        iVar5 = iVar7;
      } while (bVar13);
    }
    iVar7 = iVar5;
    isoent = piVar6;
    if (piVar6 == piVar6->parent) {
      return 0;
    }
  } while( true );
}

Assistant:

static int
write_directory_descriptors(struct archive_write *a, struct vdd *vdd)
{
	struct isoent *np;
	int depth, r;

	depth = 0;
	np = vdd->rootent;
	do {
		struct extr_rec *extr;

		r = _write_directory_descriptors(a, vdd, np, depth);
		if (r < 0)
			return (r);
		if (vdd->vdd_type != VDD_JOLIET) {
			/*
			 * This extract record is used by SUSP,RRIP.
			 * Not for joliet.
			 */
			for (extr = np->extr_rec_list.first;
			    extr != NULL;
			    extr = extr->next) {
				unsigned char *wb;

				wb = wb_buffptr(a);
				memcpy(wb, extr->buf, extr->offset);
				memset(wb + extr->offset, 0,
				    LOGICAL_BLOCK_SIZE - extr->offset);
				r = wb_consume(a, LOGICAL_BLOCK_SIZE);
				if (r < 0)
					return (r);
			}
		}

		if (np->subdirs.first != NULL && depth + 1 < vdd->max_depth) {
			/* Enter to sub directories. */
			np = np->subdirs.first;
			depth++;
			continue;
		}
		while (np != np->parent) {
			if (np->drnext == NULL) {
				/* Return to the parent directory. */
				np = np->parent;
				depth--;
			} else {
				np = np->drnext;
				break;
			}
		}
	} while (np != np->parent);

	return (ARCHIVE_OK);
}